

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead_common.c
# Opt level: O0

void ascon_aead_init(ascon_aead_ctx_t *ctx,uint8_t *key,uint8_t *nonce,uint64_t iv)

{
  uint64_t uVar1;
  undefined8 in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  undefined8 *in_RDI;
  
  uVar1 = bigendian_decode_u64(in_RSI);
  in_RDI[8] = uVar1;
  uVar1 = bigendian_decode_u64(in_RSI + 8);
  in_RDI[9] = uVar1;
  *in_RDI = in_RCX;
  in_RDI[1] = in_RDI[8];
  in_RDI[2] = in_RDI[9];
  uVar1 = bigendian_decode_u64(in_RDX);
  in_RDI[3] = uVar1;
  uVar1 = bigendian_decode_u64(in_RDX + 8);
  in_RDI[4] = uVar1;
  ascon_permutation_12((ascon_sponge_t *)0x127173);
  in_RDI[3] = in_RDI[8] ^ in_RDI[3];
  in_RDI[4] = in_RDI[9] ^ in_RDI[4];
  *(undefined1 *)(in_RDI + 7) = 0;
  return;
}

Assistant:

void
ascon_aead_init(ascon_aead_ctx_t* const ctx,
                const uint8_t* const key,
                const uint8_t* const nonce,
                const uint64_t iv)
{
    // Store the key in the context as it's required in the final step.
    ctx->k0 = bigendian_decode_u64(key);
    ctx->k1 = bigendian_decode_u64(key + sizeof(uint64_t));
    ctx->bufstate.sponge.x0 = iv;
    ctx->bufstate.sponge.x1 = ctx->k0;
    ctx->bufstate.sponge.x2 = ctx->k1;
    ctx->bufstate.sponge.x3 = bigendian_decode_u64(nonce);
    ctx->bufstate.sponge.x4 = bigendian_decode_u64(nonce + sizeof(uint64_t));
    ascon_permutation_12(&ctx->bufstate.sponge);
    ctx->bufstate.sponge.x3 ^= ctx->k0;
    ctx->bufstate.sponge.x4 ^= ctx->k1;
    ctx->bufstate.buffer_len = 0;
}